

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetReferenceTypeName(ExpressionContext *ctx,TypeBase *type)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  InplaceStr IVar6;
  
  uVar5 = (long)(type->name).end - (long)(type->name).begin;
  iVar1 = (int)uVar5;
  uVar4 = iVar1 + 5;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar4);
  IVar6.begin = (char *)CONCAT44(extraout_var,iVar2);
  if (iVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = uVar5 & 0xffffffff;
    memcpy(IVar6.begin,(type->name).begin,uVar5);
  }
  builtin_strncpy(IVar6.begin + uVar5," ref",5);
  sVar3 = strlen(IVar6.begin);
  if (sVar3 + 1 == (ulong)uVar4) {
    IVar6.end = IVar6.begin + sVar3;
    return IVar6;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x98,"InplaceStr GetReferenceTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetReferenceTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned typeNameLength = unsigned(type->name.end - type->name.begin);

	unsigned nameLength = typeNameLength + 4 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	if(typeNameLength)
		memcpy(name, type->name.begin, typeNameLength);

	memcpy(name + typeNameLength, " ref", 5);

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}